

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O3

string * __thiscall
phosg::JSON::serialize_abi_cxx11_
          (string *__return_storage_ptr__,JSON *this,uint32_t options,size_t indent_level)

{
  _Rb_tree_node_base *p_Var1;
  pointer puVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  double dVar6;
  uint uVar7;
  bool bVar8;
  string *s;
  int64_t iVar9;
  ulong uVar10;
  void *pvVar11;
  list_type *plVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  dict_type *pdVar14;
  _Rb_tree_node_base *p_Var15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  parse_error *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ulong uVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  char *pcVar21;
  undefined8 uVar22;
  char *pcVar23;
  _Alloc_hider _Var24;
  undefined8 uVar25;
  uint __len;
  pointer puVar26;
  _Hash_node_base *p_Var27;
  size_type __n;
  ulong __val;
  __node_base *p_Var28;
  StringEscapeMode mode;
  char *__data;
  bool format;
  __string_type __str;
  anon_class_40_5_0b9c1222 add_key;
  string ret;
  __string_type __str_1;
  StringEscapeMode escape_mode;
  byte local_101;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [32];
  uint32_t *local_c0;
  undefined1 local_b8 [32];
  _Rb_tree_node_base *local_98;
  size_t local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  StringEscapeMode local_68;
  uint32_t local_64;
  size_t local_60;
  string local_58;
  string *local_38;
  
  if ((options & 0x20) == 0) {
    if ((options & 0x10) == 0) {
      local_68 = STANDARD;
      mode = STANDARD;
    }
    else {
      local_68 = HEX;
      mode = HEX;
    }
  }
  else {
    local_68 = CONTROL_ONLY;
    mode = CONTROL_ONLY;
  }
  local_64 = options;
  local_60 = indent_level;
  switch(*(__index_type *)
          ((long)&(this->value).
                  super__Variant_base<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>_>
                  .
                  super__Move_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                  .
                  super__Copy_assign_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                  .
                  super__Move_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                  .
                  super__Copy_ctor_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
                  .
                  super__Variant_storage_alias<std::nullptr_t,_bool,_long,_double,_std::__cxx11::basic_string<char>,_std::vector<std::unique_ptr<phosg::JSON>_>,_std::unordered_map<std::__cxx11::basic_string<char>,_std::unique_ptr<phosg::JSON>_>_>
          + 0x38)) {
  case '\0':
    bVar8 = (options & 2) == 0;
    pcVar23 = "n";
    if (bVar8) {
      pcVar23 = "null";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar21 = pcVar23 + (ulong)bVar8 * 3 + 1;
    goto LAB_0010f3d2;
  case '\x01':
    bVar8 = as_bool(this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((options & 2) == 0) {
      pcVar23 = "false";
      if (bVar8) {
        pcVar23 = "true";
      }
      pcVar21 = pcVar23 + ((ulong)bVar8 ^ 5);
    }
    else {
      pcVar23 = "\\f";
      if (bVar8) {
        pcVar23 = "\\t";
      }
      pcVar23 = pcVar23 + 1;
      pcVar21 = "";
      if (bVar8) {
        pcVar21 = "";
      }
    }
LAB_0010f3d2:
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar23,pcVar21);
    return __return_storage_ptr__;
  case '\x02':
    iVar9 = as_int(this);
    if ((options & 1) != 0) {
      if (iVar9 < 0) {
        iVar9 = -iVar9;
        pcVar23 = "-0x%lX";
      }
      else {
        pcVar23 = "0x%lX";
      }
      string_printf_abi_cxx11_(__return_storage_ptr__,pcVar23,iVar9);
      return __return_storage_ptr__;
    }
    uVar10 = as_int(this);
    __val = -uVar10;
    if (0 < (long)uVar10) {
      __val = uVar10;
    }
    __len = 1;
    if (9 < __val) {
      uVar18 = __val;
      uVar7 = 4;
      do {
        __len = uVar7;
        if (uVar18 < 100) {
          __len = __len - 2;
          goto LAB_0010f997;
        }
        if (uVar18 < 1000) {
          __len = __len - 1;
          goto LAB_0010f997;
        }
        if (uVar18 < 10000) goto LAB_0010f997;
        bVar8 = 99999 < uVar18;
        uVar18 = uVar18 / 10000;
        uVar7 = __len + 4;
      } while (bVar8);
      __len = __len + 1;
    }
LAB_0010f997:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,(ulong)(__len - (int)((long)uVar10 >> 0x3f)),'-');
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar10 >> 0x3f),__len,__val);
    return __return_storage_ptr__;
  case '\x03':
    dVar6 = as_float(this);
    string_printf_abi_cxx11_((string *)local_b8,"%g",SUB84(dVar6,0));
    uVar25 = local_b8._8_8_;
    uVar22 = local_b8._0_8_;
    if ((local_b8._8_8_ != 0) &&
       (pvVar11 = memchr((void *)local_b8._0_8_,0x2e,local_b8._8_8_),
       pvVar11 != (void *)0x0 && (long)pvVar11 - uVar22 != -1)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar22 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_b8 + 0x10)) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_b8._16_8_;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8._24_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)uVar22;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = local_b8._16_8_;
      }
      __return_storage_ptr__->_M_string_length = uVar25;
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,uVar22,(string *)(uVar22 + uVar25));
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,".0");
    break;
  case '\x04':
    s = as_string_abi_cxx11_(this);
    escape_string((string *)local_e0,s,mode);
    pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                      0,0,"\"",1);
    local_b8._0_8_ = (pbVar16->_M_dataplus)._M_p;
    paVar17 = &pbVar16->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ == paVar17) {
      local_b8._16_8_ = paVar17->_M_allocated_capacity;
      local_b8._24_8_ = *(long *)((long)&pbVar16->field_2 + 8);
      local_b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_b8 + 0x10);
    }
    else {
      local_b8._16_8_ = paVar17->_M_allocated_capacity;
    }
    local_b8._8_8_ = pbVar16->_M_string_length;
    (pbVar16->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar16->_M_string_length = 0;
    (pbVar16->field_2)._M_local_buf[0] = '\0';
    pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     "\"");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (pbVar16->_M_dataplus)._M_p;
    paVar17 = &pbVar16->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar17) {
      uVar22 = *(undefined8 *)((long)&pbVar16->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar17->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar22;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar17->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar16->_M_string_length;
    (pbVar16->_M_dataplus)._M_p = (pointer)paVar17;
    pbVar16->_M_string_length = 0;
    (pbVar16->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_b8 + 0x10)) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
    }
    uVar22 = local_e0._16_8_;
    uVar25 = local_e0._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_e0 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_0010f984;
  case '\x05':
    plVar12 = as_list(this);
    if ((plVar12->
        super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (plVar12->
        super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar23 = "[]";
      pcVar21 = "";
      goto LAB_0010f3d2;
    }
    local_b8._0_8_ = local_b8 + 0x10;
    local_38 = __return_storage_ptr__;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"[","");
    puVar26 = (plVar12->
              super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (plVar12->
             super__Vector_base<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::allocator<std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (puVar26 != puVar2) {
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_e0 + 0x10);
      do {
        if (1 < (ulong)local_b8._8_8_) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     ',');
        }
        if ((options & 4) == 0) {
          serialize_abi_cxx11_
                    ((string *)local_e0,
                     (puVar26->_M_t).
                     super___uniq_ptr_impl<phosg::JSON,_std::default_delete<phosg::JSON>_>._M_t.
                     super__Tuple_impl<0UL,_phosg::JSON_*,_std::default_delete<phosg::JSON>_>.
                     super__Head_base<0UL,_phosg::JSON_*,_false>._M_head_impl,local_64,0);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     (char *)local_e0._0_8_,local_e0._8_8_);
          uVar22 = local_e0._16_8_;
          _Var24._M_p = (pointer)local_e0._0_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._0_8_ != paVar5) {
LAB_0010f27a:
            operator_delete(_Var24._M_p,(ulong)(uVar22 + 1));
          }
        }
        else {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_88,local_60 + 2,' ');
          pbVar13 = ::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_88,0,1,'\n');
          local_100._M_allocated_capacity = (size_type)&local_f0;
          paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(pbVar13->_M_dataplus)._M_p;
          paVar19 = &pbVar13->field_2;
          if (paVar3 == paVar19) {
            local_f0._M_allocated_capacity = paVar19->_M_allocated_capacity;
            local_f0._8_8_ = *(undefined8 *)((long)&pbVar13->field_2 + 8);
          }
          else {
            local_f0._M_allocated_capacity = paVar19->_M_allocated_capacity;
            local_100._M_allocated_capacity = (size_type)paVar3;
          }
          local_100._8_8_ = pbVar13->_M_string_length;
          (pbVar13->_M_dataplus)._M_p = (pointer)paVar19;
          pbVar13->_M_string_length = 0;
          (pbVar13->field_2)._M_local_buf[0] = '\0';
          serialize_abi_cxx11_
                    (&local_58,
                     (puVar26->_M_t).
                     super___uniq_ptr_impl<phosg::JSON,_std::default_delete<phosg::JSON>_>._M_t.
                     super__Tuple_impl<0UL,_phosg::JSON_*,_std::default_delete<phosg::JSON>_>.
                     super__Head_base<0UL,_phosg::JSON_*,_false>._M_head_impl,local_64,local_60 + 2)
          ;
          uVar22 = (byte *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_allocated_capacity != &local_f0) {
            uVar22 = local_f0._M_allocated_capacity;
          }
          if ((ulong)uVar22 < (byte *)(local_58._M_string_length + local_100._8_8_)) {
            uVar22 = (byte *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              uVar22 = local_58.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar22 < (byte *)(local_58._M_string_length + local_100._8_8_))
            goto LAB_0010f192;
            pbVar16 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_58,0,0,(char *)local_100._M_allocated_capacity,
                                 local_100._8_8_);
          }
          else {
LAB_0010f192:
            pbVar16 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_100,local_58._M_dataplus._M_p,local_58._M_string_length);
          }
          local_e0._0_8_ = (pbVar16->_M_dataplus)._M_p;
          paVar17 = &pbVar16->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._0_8_ == paVar17) {
            local_e0._16_8_ = paVar17->_M_allocated_capacity;
            local_e0._24_8_ = *(long *)((long)&pbVar16->field_2 + 8);
            local_e0._0_8_ = paVar5;
          }
          else {
            local_e0._16_8_ = paVar17->_M_allocated_capacity;
          }
          local_e0._8_8_ = pbVar16->_M_string_length;
          (pbVar16->_M_dataplus)._M_p = (pointer)paVar17;
          pbVar16->_M_string_length = 0;
          paVar17->_M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     (char *)local_e0._0_8_,local_e0._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._0_8_ != paVar5) {
            operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,
                            (ulong)(local_58.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_allocated_capacity != &local_f0) {
            operator_delete((void *)local_100._M_allocated_capacity,
                            (ulong)(local_f0._M_allocated_capacity + 1));
          }
          uVar22 = local_88.field_2._M_allocated_capacity;
          _Var24._M_p = local_88._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) goto LAB_0010f27a;
        }
        puVar26 = puVar26 + 1;
      } while (puVar26 != puVar2);
    }
    __return_storage_ptr__ = local_38;
    if ((options & 4) == 0) {
      ((_Alloc_hider *)&local_38->_M_dataplus)->_M_p = (pointer)&local_38->field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_38,local_b8._0_8_,(string *)(local_b8._0_8_ + local_b8._8_8_));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,"]");
      break;
    }
    local_100._M_allocated_capacity = (size_type)&local_f0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,local_b8._0_8_,(string *)(local_b8._0_8_ + local_b8._8_8_));
    __return_storage_ptr__ = local_38;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
               local_100._8_8_,0,1,'\n');
    paVar17 = &local_88.field_2;
    local_88._M_dataplus._M_p = (pointer)paVar17;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_88,local_60,' ');
    uVar22 = (byte *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_allocated_capacity != &local_f0) {
      uVar22 = local_f0._M_allocated_capacity;
    }
    if ((ulong)uVar22 < (byte *)(local_88._M_string_length + local_100._8_8_)) {
      uVar22 = (byte *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar17) {
        uVar22 = local_88.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < (byte *)(local_88._M_string_length + local_100._8_8_)) goto LAB_0010f726;
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace(&local_88,0,0,(char *)local_100._M_allocated_capacity,local_100._8_8_);
    }
    else {
LAB_0010f726:
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_100,local_88._M_dataplus._M_p,local_88._M_string_length);
    }
    local_e0._0_8_ = local_e0 + 0x10;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar16->_M_dataplus)._M_p;
    paVar20 = &pbVar16->field_2;
    if (paVar5 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)paVar20) {
      local_e0._16_8_ = paVar20->_M_allocated_capacity;
      local_e0._24_8_ = *(long *)((long)&pbVar16->field_2 + 8);
    }
    else {
      local_e0._16_8_ = paVar20->_M_allocated_capacity;
      local_e0._0_8_ = paVar5;
    }
    local_e0._8_8_ = pbVar16->_M_string_length;
    (pbVar16->_M_dataplus)._M_p = (pointer)paVar20;
    pbVar16->_M_string_length = 0;
    paVar20->_M_local_buf[0] = '\0';
    pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     "]");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (pbVar16->_M_dataplus)._M_p;
    paVar20 = &pbVar16->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 == paVar20) {
      uVar22 = *(undefined8 *)((long)&pbVar16->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar20->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar22;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar20->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar16->_M_string_length;
    (pbVar16->_M_dataplus)._M_p = (pointer)paVar20;
    pbVar16->_M_string_length = 0;
    (pbVar16->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_e0 + 0x10)) {
      operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar17) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_allocated_capacity != &local_f0) {
      operator_delete((void *)local_100._M_allocated_capacity,
                      (ulong)(local_f0._M_allocated_capacity + 1));
    }
    break;
  case '\x06':
    local_101 = (byte)options >> 2 & 1;
    pdVar14 = as_dict_abi_cxx11_(this);
    if ((pdVar14->_M_h)._M_element_count == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"{}","");
      return __return_storage_ptr__;
    }
    local_100._M_allocated_capacity = (size_type)&local_f0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"{","");
    local_e0._8_8_ = &local_68;
    local_e0._16_8_ = &local_101;
    local_e0._24_8_ = &local_60;
    local_c0 = &local_64;
    local_e0._0_8_ = &local_100;
    if ((options & 8) == 0) {
      p_Var28 = &(pdVar14->_M_h)._M_before_begin;
      while (p_Var28 = p_Var28->_M_nxt, p_Var28 != (__node_base *)0x0) {
        serialize::anon_class_40_5_0b9c1222::operator()
                  ((anon_class_40_5_0b9c1222 *)local_e0,(string *)(p_Var28 + 1),
                   (JSON *)p_Var28[5]._M_nxt);
      }
    }
    else {
      p_Var1 = (_Rb_tree_node_base *)(local_b8 + 8);
      local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
      local_b8._16_8_ = (byte *)0x0;
      local_90 = 0;
      p_Var27 = (pdVar14->_M_h)._M_before_begin._M_nxt;
      local_b8._24_8_ = p_Var1;
      local_98 = p_Var1;
      if (p_Var27 != (_Hash_node_base *)0x0) {
        do {
          local_88._M_dataplus._M_p = (pointer)p_Var27[5]._M_nxt;
          ::std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::JSON*>,std::_Select1st<std::pair<std::__cxx11::string_const,phosg::JSON*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,phosg::JSON*>>>
          ::_M_emplace_unique<std::__cxx11::string_const&,phosg::JSON*>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,phosg::JSON*>,std::_Select1st<std::pair<std::__cxx11::string_const,phosg::JSON*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,phosg::JSON*>>>
                      *)local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var27 + 1),(JSON **)&local_88);
          p_Var27 = p_Var27->_M_nxt;
        } while (p_Var27 != (_Hash_node_base *)0x0);
        if ((_Rb_tree_node_base *)local_b8._24_8_ != p_Var1) {
          p_Var15 = (_Rb_tree_node_base *)local_b8._24_8_;
          do {
            serialize::anon_class_40_5_0b9c1222::operator()
                      ((anon_class_40_5_0b9c1222 *)local_e0,(string *)(p_Var15 + 1),
                       *(JSON **)(p_Var15 + 2));
            p_Var15 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var15);
          } while (p_Var15 != p_Var1);
        }
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phosg::JSON_*>_>_>
                   *)local_b8);
    }
    if (local_101 == 1) {
      paVar17 = &local_88.field_2;
      local_88._M_dataplus._M_p = (pointer)paVar17;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_100._M_allocated_capacity,
                 (string *)(local_100._M_allocated_capacity + local_100._8_8_));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace_aux(&local_88,local_88._M_string_length,0,1,'\n');
      paVar5 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar5;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                 local_60,' ');
      uVar22 = (byte *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar17) {
        uVar22 = local_88.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < (byte *)(local_58._M_string_length + local_88._M_string_length)) {
        uVar22 = (byte *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar5) {
          uVar22 = local_58.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar22 < (byte *)(local_58._M_string_length + local_88._M_string_length))
        goto LAB_0010f62d;
        pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_58,0,0,local_88._M_dataplus._M_p,local_88._M_string_length);
      }
      else {
LAB_0010f62d:
        pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_88,local_58._M_dataplus._M_p,local_58._M_string_length);
      }
      local_b8._0_8_ = local_b8 + 0x10;
      paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar16->_M_dataplus)._M_p;
      paVar20 = &pbVar16->field_2;
      if (paVar3 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)paVar20) {
        local_b8._16_8_ = paVar20->_M_allocated_capacity;
        local_b8._24_8_ = *(long *)((long)&pbVar16->field_2 + 8);
      }
      else {
        local_b8._16_8_ = paVar20->_M_allocated_capacity;
        local_b8._0_8_ = paVar3;
      }
      local_b8._8_8_ = pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar20;
      pbVar16->_M_string_length = 0;
      paVar20->_M_local_buf[0] = '\0';
      pbVar16 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,"}");
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar4 = (pbVar16->_M_dataplus)._M_p;
      paVar20 = &pbVar16->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 == paVar20) {
        uVar22 = *(undefined8 *)((long)&pbVar16->field_2 + 8);
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar20->_M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar22;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = pcVar4;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar20->_M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = pbVar16->_M_string_length;
      (pbVar16->_M_dataplus)._M_p = (pointer)paVar20;
      pbVar16->_M_string_length = 0;
      (pbVar16->field_2)._M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_b8 + 0x10)) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar5) {
        operator_delete(local_58._M_dataplus._M_p,
                        (ulong)(local_58.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != paVar17) {
        operator_delete(local_88._M_dataplus._M_p,
                        (ulong)(local_88.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_100._M_allocated_capacity,
                 (string *)(local_100._M_allocated_capacity + local_100._8_8_));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,"}");
    }
    uVar22 = local_f0._M_allocated_capacity;
    uVar25 = local_100._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_allocated_capacity == &local_f0) {
      return __return_storage_ptr__;
    }
    goto LAB_0010f984;
  default:
    this_00 = (parse_error *)__cxa_allocate_exception(0x10);
    local_b8._0_8_ = local_b8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"unknown object type","");
    parse_error::parse_error(this_00,(string *)local_b8);
    __cxa_throw(this_00,&parse_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar22 = local_b8._16_8_;
  uVar25 = local_b8._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_b8 + 0x10)) {
    return __return_storage_ptr__;
  }
LAB_0010f984:
  operator_delete((void *)uVar25,(ulong)(uVar22 + 1));
  return __return_storage_ptr__;
}

Assistant:

string JSON::serialize(uint32_t options, size_t indent_level) const {
  StringEscapeMode escape_mode;
  if (options & SerializeOption::ESCAPE_CONTROLS_ONLY) {
    escape_mode = StringEscapeMode::CONTROL_ONLY;
  } else if (options & SerializeOption::HEX_ESCAPE_CODES) {
    escape_mode = StringEscapeMode::HEX;
  } else {
    escape_mode = StringEscapeMode::STANDARD;
  }

  size_t type_index = this->value.index();
  switch (type_index) {
    case 0: // nullptr_t
      return (options & SerializeOption::ONE_CHARACTER_TRIVIAL_CONSTANTS) ? "n" : "null";

    case 1: // bool
      if (options & SerializeOption::ONE_CHARACTER_TRIVIAL_CONSTANTS) {
        return this->as_bool() ? "t" : "f";
      } else {
        return this->as_bool() ? "true" : "false";
      }

    case 2: { // int64_t
      int64_t v = this->as_int();
      if (options & SerializeOption::HEX_INTEGERS) {
        return v < 0 ? string_printf("-0x%" PRIX64, -v) : string_printf("0x%" PRIX64, v);
      } else {
        return to_string(this->as_int());
      }
    }

    case 3: { // double
      string ret = string_printf("%g", this->as_float());
      if (ret.find('.') == string::npos) {
        return ret + ".0";
      }
      return ret;
    }

    case 4: // string
      return "\"" + JSON::escape_string(this->as_string(), escape_mode) + "\"";

    case 5: { // list_type
      bool format = options & SerializeOption::FORMAT;

      const auto& list = this->as_list();
      if (list.empty()) {
        return "[]";
      }

      string ret = "[";
      for (const unique_ptr<JSON>& o : list) {
        if (ret.size() > 1) {
          ret += ',';
        }
        if (format) {
          ret += '\n' + string(indent_level + 2, ' ') + o->serialize(options, indent_level + 2);
        } else {
          ret += o->serialize(options);
        }
      }
      if (format) {
        return ret + '\n' + string(indent_level, ' ') + "]";
      } else {
        return ret + "]";
      }
    }

    case 6: { // dict_type
      bool format = options & SerializeOption::FORMAT;
      bool sort_keys = options & SerializeOption::SORT_DICT_KEYS;

      const auto& dict = this->as_dict();
      if (dict.empty()) {
        return "{}";
      }

      string ret = "{";
      auto add_key = [&](const string& key, const JSON& value) -> void {
        if (ret.size() > 1) {
          ret += ',';
        }
        string escaped_key = JSON::escape_string(key, escape_mode);
        if (format) {
          ret += '\n' + string(indent_level + 2, ' ') + "\"" + escaped_key + "\": " + value.serialize(options, indent_level + 2);
        } else {
          ret += "\"" + escaped_key + "\":" + value.serialize(options);
        }
      };

      if (sort_keys) {
        // Note: We're kind of breaking abstraction here (the values in sorted
        // point to objects owned by unique_ptrs) but the lifetimes of these
        // objects are assumed to span this entire function, so it's ok to do
        // this temporarily.
        map<string, JSON*> sorted;
        for (const auto& o : dict) {
          sorted.emplace(o.first, o.second.get());
        }
        for (const auto& o : sorted) {
          add_key(o.first, *o.second);
        }
      } else {
        for (const auto& o : dict) {
          add_key(o.first, *o.second);
        }
      }
      if (format) {
        return ret + '\n' + string(indent_level, ' ') + "}";
      } else {
        return ret + "}";
      }
    }

    default:
      throw parse_error("unknown object type");
  }
}